

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O1

size_t __thiscall
xray_re::xr_reader::find_chunk(xr_reader *this,uint32_t find_id,bool *compressed,bool reset)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  undefined7 in_register_00000009;
  ulong in_R8;
  uint *puVar4;
  
  if ((int)CONCAT71(in_register_00000009,reset) != 0) {
    this->field_2 = (anon_union_8_7_9f64dffd_for_xr_reader_2)this->m_data;
  }
  puVar2 = (uint *)this->m_end;
  do {
    puVar4 = (uint *)(this->field_2).m_p_s32;
    if (puVar2 <= puVar4) {
      return 0;
    }
    if (puVar2 < puVar4 + 2) {
      __assert_fail("m_p + 8 <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                    ,0x1a,"size_t xray_re::xr_reader::find_chunk(uint32_t, bool *, bool)");
    }
    (this->field_2).m_p = (uint8_t *)(puVar4 + 1);
    uVar1 = *puVar4;
    (this->field_2).m_p = (uint8_t *)(puVar4 + 2);
    uVar3 = (ulong)puVar4[1];
    puVar4 = (uint *)((long)puVar4 + uVar3 + 8);
    if (puVar2 < puVar4) {
      __assert_fail("m_p + size <= m_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                    ,0x1d,"size_t xray_re::xr_reader::find_chunk(uint32_t, bool *, bool)");
    }
    if ((uVar1 & 0x7fffffff) == find_id) {
      if ((int)uVar1 < 0 && compressed == (bool *)0x0) {
        __assert_fail("compressed || (id & CHUNK_COMPRESSED) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                      ,0x1f,"size_t xray_re::xr_reader::find_chunk(uint32_t, bool *, bool)");
      }
      in_R8 = uVar3;
      if (compressed != (bool *)0x0) {
        *compressed = SUB41(uVar1 >> 0x1f,0);
      }
    }
    else {
      (this->field_2).m_p = (uint8_t *)puVar4;
    }
  } while ((uVar1 & 0x7fffffff) != find_id);
  return in_R8;
}

Assistant:

size_t xr_reader::find_chunk(uint32_t find_id, bool* compressed, bool reset)
{
	if (reset)
		m_p = m_data;
	while (m_p < m_end) {
		assert(m_p + 8 <= m_end);
		uint32_t id = r_u32();
		size_t size = r_u32();
		assert(m_p + size <= m_end);
		if (find_id == (id & CHUNK_ID_MASK)) {
			xr_assert(compressed || (id & CHUNK_COMPRESSED) == 0);
			if (compressed != 0)
				*compressed = (id & CHUNK_COMPRESSED) != 0;
//			m_debug_find_chunk = m_p + size;
			return size;
		}
		m_p += size;
	}
	return 0;
}